

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

void __thiscall
argparse::ArgumentParser::parse_args_internal
          (ArgumentParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *raw_arguments)

{
  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
  *this_00;
  _List_node_base *p_Var1;
  undefined8 uVar2;
  ArgumentParser *this_01;
  bool bVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  start;
  iterator iVar4;
  iterator iVar5;
  mapped_type_conflict *pmVar6;
  runtime_error *prVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  _List_node_base *p_Var10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  _Self __tmp;
  ulong uVar11;
  string_view prefix_chars;
  string_view input;
  string_view sVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unprocessed_arguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  string_view maybe_command;
  undefined1 local_110 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0 [2];
  ArgumentParser *local_d0;
  _List_node_base *local_c8;
  _Base_ptr local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  key_type local_40;
  
  preprocess_arguments(&local_b8,this,raw_arguments);
  if (((this->m_program_name)._M_string_length == 0) &&
     (local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->m_program_name,
               local_b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 1 !=
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_c8 = (_List_node_base *)&this->m_positional_arguments;
    p_Var10 = (this->m_positional_arguments).
              super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl.
              _M_node.super__List_node_base._M_next;
    this_00 = &this->m_argument_map;
    local_c0 = &(this->m_argument_map)._M_t._M_impl.super__Rb_tree_header._M_header;
    __first._M_current =
         local_b8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start + 1;
    local_d0 = this;
    do {
      this_01 = local_d0;
      sVar12._M_str = ((__first._M_current)->_M_dataplus)._M_p;
      sVar12._M_len = (__first._M_current)->_M_string_length;
      prefix_chars._M_str = (local_d0->m_prefix_chars)._M_dataplus._M_p;
      prefix_chars._M_len = (local_d0->m_prefix_chars)._M_string_length;
      bVar3 = Argument::is_positional(sVar12,prefix_chars);
      if (bVar3) {
        if (p_Var10 == local_c8) {
          local_40._M_str = ((__first._M_current)->_M_dataplus)._M_p;
          local_40._M_len = (__first._M_current)->_M_string_length;
          iVar5 = std::
                  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>_>_>_>
                  ::find(&(this_01->m_subparser_map)._M_t,&local_40);
          if ((_Rb_tree_header *)iVar5._M_node ==
              &(this_01->m_subparser_map)._M_t._M_impl.super__Rb_tree_header) {
            if ((((_List_base<argparse::Argument,_std::allocator<argparse::Argument>_> *)
                 &local_c8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next != local_c8) {
              prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_f0,
                             "Maximum number of positional arguments exceeded, failed to parse \'",
                             __first._M_current);
              pbVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_f0,"\'");
              local_110._0_8_ = (pbVar8->_M_dataplus)._M_p;
              paVar9 = &pbVar8->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._0_8_ == paVar9) {
                local_110._16_8_ = paVar9->_M_allocated_capacity;
                local_110._24_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                local_110._0_8_ = (pointer)(local_110 + 0x10);
              }
              else {
                local_110._16_8_ = paVar9->_M_allocated_capacity;
              }
              local_110._8_8_ = pbVar8->_M_string_length;
              (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
              pbVar8->_M_string_length = 0;
              (pbVar8->field_2)._M_local_buf[0] = '\0';
              std::runtime_error::runtime_error(prVar7,(string *)local_110);
              __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            if ((local_d0->m_subparser_map)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
              prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_80,"Failed to parse \'",__first._M_current);
              pbVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_80,"\', did you mean \'");
              local_a0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
              input._M_str = &pbVar8->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p == input._M_str) {
                local_a0.field_2._M_allocated_capacity = (input._M_str)->_M_allocated_capacity;
                local_a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              }
              else {
                local_a0.field_2._M_allocated_capacity = (input._M_str)->_M_allocated_capacity;
              }
              local_a0._M_string_length = pbVar8->_M_string_length;
              (pbVar8->_M_dataplus)._M_p = (pointer)input._M_str;
              pbVar8->_M_string_length = 0;
              (pbVar8->field_2)._M_local_buf[0] = '\0';
              input._M_len = (size_t)((__first._M_current)->_M_dataplus)._M_p;
              sVar12 = details::
                       get_most_similar_string<std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>>>
                                 ((details *)&this_01->m_subparser_map,
                                  (map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>_>_>_>
                                   *)(__first._M_current)->_M_string_length,input);
              local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_60,sVar12._M_str,sVar12._M_str + sVar12._M_len);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_f0,&local_a0,&local_60);
              pbVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_f0,"\'");
              local_110._0_8_ = (pbVar8->_M_dataplus)._M_p;
              paVar9 = &pbVar8->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._0_8_ == paVar9) {
                local_110._16_8_ = paVar9->_M_allocated_capacity;
                local_110._24_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                local_110._0_8_ = (pointer)(local_110 + 0x10);
              }
              else {
                local_110._16_8_ = paVar9->_M_allocated_capacity;
              }
              local_110._8_8_ = pbVar8->_M_string_length;
              (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
              pbVar8->_M_string_length = 0;
              (pbVar8->field_2)._M_local_buf[0] = '\0';
              std::runtime_error::runtime_error(prVar7,(string *)local_110);
              __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            p_Var10 = (local_d0->m_optional_arguments).
                      super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>.
                      _M_impl._M_node.super__List_node_base._M_next;
            if (p_Var10 == (_List_node_base *)&local_d0->m_optional_arguments) {
              prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar7,"Zero positional arguments expected");
            }
            else {
              do {
                if ((p_Var10[0xd]._M_next == (_List_node_base *)0x0) &&
                   (((ulong)p_Var10[0x15]._M_next & 0x10) == 0)) {
                  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
                  Argument::get_usage_full_abi_cxx11_((string *)local_f0,(Argument *)(p_Var10 + 1));
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_110,"Zero positional arguments expected, did you mean ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_f0);
                  std::runtime_error::runtime_error(prVar7,(string *)local_110);
                  __cxa_throw(prVar7,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                p_Var10 = p_Var10->_M_next;
              } while (p_Var10 != (_List_node_base *)&local_d0->m_optional_arguments);
              prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar7,"Zero positional arguments expected");
            }
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          vector<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_110,
                     __first,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_b8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,
                     (allocator_type *)local_f0[0]._M_local_buf);
          this_01->m_is_parsed = true;
          pmVar6 = std::
                   map<std::basic_string_view<char,_std::char_traits<char>_>,_bool,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>_>_>
                   ::operator[](&this_01->m_subparser_used,&local_40);
          *pmVar6 = true;
          parse_args((ArgumentParser *)(iVar5._M_node[1]._M_left)->_M_left,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_110);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_110);
          goto LAB_0011d34b;
        }
        p_Var1 = p_Var10->_M_next;
        start = Argument::
                consume<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((Argument *)(p_Var10 + 1),__first,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_b8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,(string_view)ZEXT816(0));
        p_Var10 = p_Var1;
      }
      else {
        local_110._8_8_ = ((__first._M_current)->_M_dataplus)._M_p;
        local_110._0_8_ = (__first._M_current)->_M_string_length;
        iVar4 = std::
                _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
                ::find(&this_00->_M_t,(key_type *)local_110);
        if (iVar4._M_node == local_c0) {
          if ((((__first._M_current)->_M_string_length < 2) ||
              (bVar3 = is_valid_prefix_char(this_01,*((__first._M_current)->_M_dataplus)._M_p),
              !bVar3)) ||
             (bVar3 = is_valid_prefix_char(this_01,((__first._M_current)->_M_dataplus)._M_p[1]),
             bVar3)) {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_110,"Unknown argument: ",__first._M_current);
            std::runtime_error::runtime_error(prVar7,(string *)local_110);
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          start._M_current = __first._M_current + 1;
          if (1 < (__first._M_current)->_M_string_length) {
            uVar11 = 1;
            do {
              uVar2 = local_110._16_8_;
              local_110._0_8_ = local_110 + 0x10;
              local_110._16_2_ =
                   (ushort)(byte)((__first._M_current)->_M_dataplus)._M_p[uVar11] << 8 | 0x2d;
              local_110._8_8_ = (pointer)0x2;
              local_110._19_5_ = SUB85(uVar2,3);
              local_110[0x12] = 0;
              local_f0[0]._M_allocated_capacity = 2;
              local_f0[0]._8_8_ = local_110._0_8_;
              iVar4 = std::
                      _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
                      ::find(&this_00->_M_t,(key_type *)local_f0);
              if (iVar4._M_node == local_c0) {
                prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_f0,"Unknown argument: ",__first._M_current);
                std::runtime_error::runtime_error(prVar7,(string *)local_f0[0]._M_local_buf);
                __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              start = Argument::
                      consume<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                ((Argument *)&(iVar4._M_node[1]._M_left)->_M_left,start,
                                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_b8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,
                                 *(string_view *)(iVar4._M_node + 1));
              if ((pointer)local_110._0_8_ != (pointer)(local_110 + 0x10)) {
                operator_delete((void *)local_110._0_8_,(ulong)(local_110._16_8_ + 1));
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 < (__first._M_current)->_M_string_length);
          }
        }
        else {
          start = Argument::
                  consume<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            ((Argument *)&(iVar4._M_node[1]._M_left)->_M_left,__first._M_current + 1
                             ,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )local_b8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                             *(string_view *)(iVar4._M_node + 1));
        }
      }
      __first._M_current = start._M_current;
      this = local_d0;
    } while (start._M_current !=
             local_b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  this->m_is_parsed = true;
LAB_0011d34b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  return;
}

Assistant:

void parse_args_internal(const std::vector<std::string> &raw_arguments) {
    auto arguments = preprocess_arguments(raw_arguments);
    if (m_program_name.empty() && !arguments.empty()) {
      m_program_name = arguments.front();
    }
    auto end = std::end(arguments);
    auto positional_argument_it = std::begin(m_positional_arguments);
    for (auto it = std::next(std::begin(arguments)); it != end;) {
      const auto &current_argument = *it;
      if (Argument::is_positional(current_argument, m_prefix_chars)) {
        if (positional_argument_it == std::end(m_positional_arguments)) {

          std::string_view maybe_command = current_argument;

          // Check sub-parsers
          auto subparser_it = m_subparser_map.find(maybe_command);
          if (subparser_it != m_subparser_map.end()) {

            // build list of remaining args
            const auto unprocessed_arguments =
                std::vector<std::string>(it, end);

            // invoke subparser
            m_is_parsed = true;
            m_subparser_used[maybe_command] = true;
            return subparser_it->second->get().parse_args(
                unprocessed_arguments);
          }

          if (m_positional_arguments.empty()) {

            // Ask the user if they argument they provided was a typo
            // for some sub-parser,
            // e.g., user provided `git totes` instead of `git notes`
            if (!m_subparser_map.empty()) {
              throw std::runtime_error(
                  "Failed to parse '" + current_argument + "', did you mean '" +
                  std::string{details::get_most_similar_string(
                      m_subparser_map, current_argument)} +
                  "'");
            }

            // Ask the user if they meant to use a specific optional argument
            if (!m_optional_arguments.empty()) {
              for (const auto &opt : m_optional_arguments) {
                if (!opt.m_implicit_value.has_value()) {
                  // not a flag, requires a value
                  if (!opt.m_is_used) {
                    throw std::runtime_error(
                        "Zero positional arguments expected, did you mean " +
                        opt.get_usage_full());
                  }
                }
              }

              throw std::runtime_error("Zero positional arguments expected");
            } else {
              throw std::runtime_error("Zero positional arguments expected");
            }
          } else {
            throw std::runtime_error("Maximum number of positional arguments "
                                     "exceeded, failed to parse '" +
                                     current_argument + "'");
          }
        }
        auto argument = positional_argument_it++;
        it = argument->consume(it, end);
        continue;
      }

      auto arg_map_it = m_argument_map.find(current_argument);
      if (arg_map_it != m_argument_map.end()) {
        auto argument = arg_map_it->second;
        it = argument->consume(std::next(it), end, arg_map_it->first);
      } else if (const auto &compound_arg = current_argument;
                 compound_arg.size() > 1 &&
                 is_valid_prefix_char(compound_arg[0]) &&
                 !is_valid_prefix_char(compound_arg[1])) {
        ++it;
        for (std::size_t j = 1; j < compound_arg.size(); j++) {
          auto hypothetical_arg = std::string{'-', compound_arg[j]};
          auto arg_map_it2 = m_argument_map.find(hypothetical_arg);
          if (arg_map_it2 != m_argument_map.end()) {
            auto argument = arg_map_it2->second;
            it = argument->consume(it, end, arg_map_it2->first);
          } else {
            throw std::runtime_error("Unknown argument: " + current_argument);
          }
        }
      } else {
        throw std::runtime_error("Unknown argument: " + current_argument);
      }
    }
    m_is_parsed = true;
  }